

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ActivationSigmoid * __thiscall
CoreML::Specification::ActivationParams::mutable_sigmoid(ActivationParams *this)

{
  ActivationLinear *this_00;
  
  if (this->_oneof_case_[0] == 0x28) {
    this_00 = (this->NonlinearityType_).linear_;
  }
  else {
    clear_NonlinearityType(this);
    this->_oneof_case_[0] = 0x28;
    this_00 = (ActivationLinear *)operator_new(0x18);
    ActivationSigmoid::ActivationSigmoid((ActivationSigmoid *)this_00);
    (this->NonlinearityType_).sigmoid_ = (ActivationSigmoid *)this_00;
  }
  return (ActivationSigmoid *)this_00;
}

Assistant:

inline ::CoreML::Specification::ActivationSigmoid* ActivationParams::mutable_sigmoid() {
  if (!has_sigmoid()) {
    clear_NonlinearityType();
    set_has_sigmoid();
    NonlinearityType_.sigmoid_ = new ::CoreML::Specification::ActivationSigmoid;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ActivationParams.sigmoid)
  return NonlinearityType_.sigmoid_;
}